

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoel.cpp
# Opt level: O1

bool __thiscall TPZGeoEl::VerifyNodeCoordinates(TPZGeoEl *this,REAL tol)

{
  TPZGeoMesh *pTVar1;
  int iVar2;
  int iVar3;
  int64_t nelem;
  TPZGeoNode *pTVar4;
  ostream *poVar5;
  int dim_1;
  bool bVar6;
  int dim;
  long lVar7;
  double dVar8;
  TPZManVector<double,_3> NodeX;
  TPZManVector<double,_3> MappedX;
  TPZManVector<double,_3> qsi;
  stringstream mess;
  long *local_280;
  long local_278;
  long local_270 [2];
  TPZManVector<double,_3> local_260;
  TPZManVector<double,_3> local_228;
  TPZManVector<double,_3> local_1f0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  iVar2 = (**(code **)(*(long *)this + 0x98))();
  iVar3 = (**(code **)(*(long *)this + 0x210))(this);
  TPZManVector<double,_3>::TPZManVector(&local_1f0,(long)iVar3);
  TPZManVector<double,_3>::TPZManVector(&local_228,3);
  TPZManVector<double,_3>::TPZManVector(&local_260,3);
  bVar6 = iVar2 < 1;
  if (0 < iVar2) {
    iVar3 = 0;
    do {
      lVar7 = 0;
      do {
        pTVar1 = this->fMesh;
        nelem = (**(code **)(*(long *)this + 0xa8))(this,iVar3);
        pTVar4 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&(pTVar1->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
        local_260.super_TPZVec<double>.fStore[lVar7] = pTVar4->fCoord[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      (**(code **)(*(long *)this + 0x260))(this,iVar3,&local_1f0);
      (**(code **)(*(long *)this + 0x228))(this,&local_1f0,&local_228);
      dVar8 = 0.0;
      lVar7 = 0;
      do {
        dVar8 = dVar8 + (local_260.super_TPZVec<double>.fStore[lVar7] -
                        local_228.super_TPZVec<double>.fStore[lVar7]) *
                        (local_260.super_TPZVec<double>.fStore[lVar7] -
                        local_228.super_TPZVec<double>.fStore[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      if ((tol < dVar8) || (NAN(dVar8))) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"FATAL ERROR AT ",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"bool TPZGeoEl::VerifyNodeCoordinates(REAL)",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8," - Node coordinate differs from mapped node.\n",0x2d);
        (**(code **)(*(long *)this + 0x1a0))(this,local_1a8);
        std::__cxx11::stringbuf::str();
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_280,local_278);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if (local_280 != local_270) {
          operator_delete(local_280,local_270[0] + 1);
        }
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoel.cpp"
                   ,0x6d2);
      }
      iVar3 = iVar3 + 1;
      bVar6 = iVar2 <= iVar3;
    } while (iVar3 != iVar2);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_260);
  TPZManVector<double,_3>::~TPZManVector(&local_228);
  TPZManVector<double,_3>::~TPZManVector(&local_1f0);
  return bVar6;
}

Assistant:

bool TPZGeoEl::VerifyNodeCoordinates(REAL tol){
	const int nnodes = this->NCornerNodes();
	TPZManVector<REAL,3> qsi(this->Dimension());
	TPZManVector<REAL,3> MappedX(3), NodeX(3);
	for(int inode = 0; inode < nnodes; inode++){
		for(int dim = 0; dim < 3; dim++){
			NodeX[dim] = this->NodePtr(inode)->Coord(dim);
		}//dim
		this->CenterPoint(inode,qsi);
		this->X(qsi,MappedX);
		REAL error = 0.;
		for(int dim = 0; dim < 3; dim++){
			error += (NodeX[dim]-MappedX[dim])*(NodeX[dim]-MappedX[dim]);
		}//dim
		error = sqrt(error);
		if(error > tol || !(error==error)){
			std::stringstream mess;
			mess << "FATAL ERROR AT " << __PRETTY_FUNCTION__ << " - Node coordinate differs from mapped node.\n";
			this->Print(mess);
			PZError << mess.str() << "\n";
#ifdef PZ_LOG
			LOGPZ_ERROR(logger,mess.str().c_str());
#endif
			DebugStop();
			return false;
		}
	}//for i
	return true;
}